

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpheaders.cpp
# Opt level: O2

optional<QByteArrayView> * __thiscall
QHttpHeadersPrivate::findValue
          (optional<QByteArrayView> *__return_storage_ptr__,QHttpHeadersPrivate *this,
          HeaderName *name)

{
  char *pcVar1;
  bool bVar2;
  long lVar3;
  Header *__lhs;
  
  __lhs = (this->headers).d.ptr;
  lVar3 = (this->headers).d.size * 0x38;
  do {
    if (lVar3 == 0) {
      bVar2 = false;
LAB_00184d10:
      (__return_storage_ptr__->super__Optional_base<QByteArrayView,_true,_true>)._M_payload.
      super__Optional_payload_base<QByteArrayView>._M_engaged = bVar2;
      return __return_storage_ptr__;
    }
    bVar2 = std::operator==((variant<QHttpHeaders::WellKnownHeader,_QByteArray> *)__lhs,&name->data)
    ;
    if (bVar2) {
      pcVar1 = (__lhs->value).d.ptr;
      (__return_storage_ptr__->super__Optional_base<QByteArrayView,_true,_true>)._M_payload.
      super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_size =
           (__lhs->value).d.size;
      (__return_storage_ptr__->super__Optional_base<QByteArrayView,_true,_true>)._M_payload.
      super__Optional_payload_base<QByteArrayView>._M_payload._M_value.m_data = pcVar1;
      bVar2 = true;
      goto LAB_00184d10;
    }
    __lhs = __lhs + 1;
    lVar3 = lVar3 + -0x38;
  } while( true );
}

Assistant:

const noexcept
{
    for (const auto &h : headers) {
        if (h.name == name)
            return h.value;
    }
    return std::nullopt;
}